

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexPacket.cpp
# Opt level: O3

void __thiscall rr::VertexPacketAllocator::~VertexPacketAllocator(VertexPacketAllocator *this)

{
  pointer ppVVar1;
  pointer ppcVar2;
  pointer ppcVar3;
  ulong uVar4;
  
  ppcVar3 = (this->m_allocations).super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppcVar2 = (this->m_allocations).super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppcVar2 != ppcVar3) {
    uVar4 = 0;
    do {
      if (ppcVar3[uVar4] != (char *)0x0) {
        operator_delete__(ppcVar3[uVar4]);
        ppcVar3 = (this->m_allocations).
                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppcVar2 = (this->m_allocations).
                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)ppcVar2 - (long)ppcVar3 >> 3));
  }
  if (ppcVar2 != ppcVar3) {
    (this->m_allocations).super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppcVar3;
  }
  ppVVar1 = (this->m_singleAllocPool).
            super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppVVar1 != (pointer)0x0) {
    operator_delete(ppVVar1,(long)(this->m_singleAllocPool).
                                  super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVVar1
                   );
    ppcVar3 = (this->m_allocations).
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppcVar3 != (pointer)0x0) {
    operator_delete(ppcVar3,(long)(this->m_allocations).
                                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar3)
    ;
    return;
  }
  return;
}

Assistant:

VertexPacketAllocator::~VertexPacketAllocator (void)
{
	for (size_t i = 0; i < m_allocations.size(); ++i)
		delete [] m_allocations[i];
	m_allocations.clear();
}